

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

void M_Drawer(void)

{
  long lVar1;
  FFont *this;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  BYTE *string;
  uint uVar7;
  
  lVar5 = (long)consoleplayer;
  lVar1 = (&DAT_00a60408)[lVar5 * 0x54];
  uVar7 = 0;
  uVar3 = 0;
  if (lVar1 != 0) {
    uVar3 = uVar7;
    if ((*(byte *)(lVar1 + 0x20) & 0x20) == 0) {
      if (screen->Accel2D == false) {
        if ((gamestate == GS_TITLELEVEL) || (gamestate == GS_LEVEL)) {
          puVar6 = &players + lVar5 * 0x54;
          if (*(undefined8 **)(lVar1 + 0x200) != (undefined8 *)0x0) {
            puVar6 = *(undefined8 **)(lVar1 + 0x200);
          }
          uVar3 = (int)(*(float *)(puVar6 + 0x35) * 255.0) & 0xffU |
                  ((int)(*(float *)((long)puVar6 + 0x1a4) * 255.0) & 0xffU) << 8 |
                  ((int)(*(float *)(puVar6 + 0x34) * 255.0) & 0xffU) << 0x10 |
                  (int)(*(float *)((long)puVar6 + 0x1ac) * 255.0) << 0x18;
        }
      }
    }
    else {
      (&DAT_00a60408)[lVar5 * 0x54] = 0;
    }
  }
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    iVar2 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xb])();
    if ((char)iVar2 != '\0') {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xd])
                (screen,(ulong)uVar3);
    }
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[10])();
  }
  if ((show_outdated_iwad_warning == true) && (DrawOutdatedIWADWarning()::needDisplay == '\0')) {
    uVar3 = I_MSTime();
    if (DrawOutdatedIWADWarning()::startTime == '\0') {
      M_Drawer();
    }
    this = SmallFont;
    if ((int)(uVar3 - DrawOutdatedIWADWarning()::startTime) < 10000) {
      string = (BYTE *)FStringTable::operator()(&GStrings,"MNU_OUTDATED_IWAD");
      iVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar4 = FFont::StringWidth(this,string);
      DCanvas::DrawText((DCanvas *)screen,this,(uint)(499 < (int)uVar3 % 1000) * 3 + 6,
                        (iVar2 - iVar4 * CleanXfac) / 2,this->FontHeight,(char *)string,0x40001393,1
                        ,0);
    }
    else {
      DrawOutdatedIWADWarning()::needDisplay = '\x01';
    }
  }
  return;
}

Assistant:

void M_Drawer (void) 
{
	player_t *player = &players[consoleplayer];
	AActor *camera = player->camera;
	PalEntry fade = 0;

	if (!screen->Accel2D && camera != NULL && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
	{
		if (camera->player != NULL)
		{
			player = camera->player;
		}
		fade = PalEntry (BYTE(player->BlendA*255), BYTE(player->BlendR*255), BYTE(player->BlendG*255), BYTE(player->BlendB*255));
	}


	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		if (DMenu::CurrentMenu->DimAllowed()) screen->Dim(fade);
		DMenu::CurrentMenu->Drawer();
	}

	DrawOutdatedIWADWarning();
}